

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O3

void __thiscall
xmrig::SelfSelectClient::SelfSelectClient
          (SelfSelectClient *this,int id,char *agent,IClientListener *listener)

{
  Client *this_00;
  
  (this->super_IClient)._vptr_IClient = (_func_int **)&PTR__SelfSelectClient_001acbb0;
  (this->super_IClientListener)._vptr_IClientListener =
       (_func_int **)&PTR__SelfSelectClient_001accc0;
  (this->super_IHttpListener)._vptr_IHttpListener = (_func_int **)&PTR__SelfSelectClient_001acd08;
  this->m_active = false;
  this->m_quiet = false;
  this->m_listener = listener;
  this->m_retries = 5;
  this->m_failures = 0;
  this->m_sequence = 1;
  (this->m_job).m_extraIters = 0;
  (this->m_job).m_seed.m_data = (char *)0x0;
  (this->m_job).m_seed.m_size = 0;
  (this->m_job).m_size = 0;
  (this->m_job).m_clientId.m_data = (char *)0x0;
  (this->m_job).m_clientId.m_size = 0;
  (this->m_job).m_extraNonce.m_data = (char *)0x0;
  (this->m_job).m_extraNonce.m_size = 0;
  (this->m_job).m_id.m_data = (char *)0x0;
  (this->m_job).m_id.m_size = 0;
  (this->m_job).m_poolWallet.m_data = (char *)0x0;
  *(undefined8 *)((long)&(this->m_job).m_poolWallet.m_data + 4) = 0;
  *(undefined8 *)((long)&(this->m_job).m_poolWallet.m_size + 4) = 0;
  memset(&(this->m_job).m_diff,0,0x99);
  this->m_state = IdleState;
  this->m_retryPause = 5000;
  this->m_timestamp = 0;
  this_00 = (Client *)operator_new(0x4ae8);
  Client::Client(this_00,id,agent,&this->super_IClientListener);
  this->m_client = (IClient *)this_00;
  return;
}

Assistant:

xmrig::SelfSelectClient::SelfSelectClient(int id, const char *agent, IClientListener *listener) :
    m_listener(listener)
{
    m_client = new Client(id, agent, this);
}